

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

wchar_t cmd_get_arg_point(command_conflict *cmd,char *arg,loc *grid)

{
  int iVar1;
  long lVar2;
  char *__s1;
  
  __s1 = cmd->arg[0].name;
  lVar2 = 4;
  do {
    iVar1 = strcmp(__s1,arg);
    if (iVar1 == 0) {
      if (((cmd_arg *)(__s1 + -0x10))->type != arg_POINT) {
        return L'\xfffffffe';
      }
      *grid = *(loc *)(__s1 + -8);
      return L'\0';
    }
    __s1 = __s1 + 0x28;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return L'\xffffffff';
}

Assistant:

int cmd_get_arg_point(struct command *cmd, const char *arg, struct loc *grid)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_POINT, &data)) == CMD_OK) {
		*grid = data.point;
	}

	return err;
}